

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

ssize_t strhex_to_bin(uint8_t *buffer,size_t buffer_len,char *src)

{
  int8_t iVar1;
  byte bVar2;
  size_t sVar3;
  ssize_t sVar4;
  ulong uVar5;
  
  sVar3 = strlen(src);
  sVar4 = -1;
  if (sVar3 >> 1 <= buffer_len && (sVar3 & 1) == 0) {
    sVar4 = 0;
    for (uVar5 = 0; uVar5 < sVar3; uVar5 = uVar5 + 2) {
      iVar1 = _hexchar_to_value(src[sVar4 * 2]);
      bVar2 = _hexchar_to_value(src[sVar4 * 2 + 1]);
      if ((iVar1 < '\0') || ((char)bVar2 < '\0')) {
        return -1;
      }
      buffer[sVar4] = bVar2 | iVar1 << 4;
      sVar4 = sVar4 + 1;
    }
  }
  return sVar4;
}

Assistant:

ssize_t
strhex_to_bin(uint8_t *buffer, size_t buffer_len, const char *src) {
  size_t srclen, i, j;
  int8_t v1, v2;
  srclen = strlen(src);
  if ((srclen & 1) != 0 || buffer_len < srclen/2) {
    return -1;
  }

  for (i=0, j=0; i<srclen; j++) {
    v1 = _hexchar_to_value(src[i++]);
    v2 = _hexchar_to_value(src[i++]);

    if (v1 < 0 || v2 < 0) {
      return -1;
    }
    buffer[j] = (v1 << 4) | v2;
  }
  return j;
}